

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_22(QPDF *pdf,char *arg2)

{
  reference pvVar1;
  ostream *poVar2;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageDocumentHelper dh;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> avStack_b8 [24];
  QPDFPageDocumentHelper local_a0;
  QPDFPageObjectHelper local_80;
  QPDFPageObjectHelper local_48;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_a0,pdf);
  QPDFPageDocumentHelper::getAllPages();
  pvVar1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                     (avStack_b8,0);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_48,pvVar1);
  QPDFPageDocumentHelper::removePage((QPDFPageObjectHelper *)&local_a0);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_48);
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_80,pvVar1);
  QPDFPageDocumentHelper::removePage((QPDFPageObjectHelper *)&local_a0);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_80);
  poVar2 = std::operator<<((ostream *)&std::cout,"you can\'t see this");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(avStack_b8);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_a0);
  return;
}

Assistant:

static void
test_22(QPDF& pdf, char const* arg2)
{
    // Try to remove a page we don't have
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> pages = dh.getAllPages();
    QPDFPageObjectHelper& page = pages.at(0);
    dh.removePage(page);
    dh.removePage(page);
    std::cout << "you can't see this" << std::endl;
}